

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapUniq.c
# Opt level: O3

int Amap_LibFindNode(Amap_Lib_t *pLib,int iFan0,int iFan1,int fXor)

{
  void *pvVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  
  if (fXor == 0) {
    if ((iFan0 < 0) || (pLib->vRules->nSize <= iFan0)) goto LAB_00448ff6;
    pvVar1 = pLib->vRules->pArray[(uint)iFan0];
    lVar2 = (long)*(int *)((long)pvVar1 + 4);
    if (lVar2 < 1) {
      return -1;
    }
    lVar3 = 0;
    while (iVar4 = *(int *)(*(long *)((long)pvVar1 + 8) + lVar3 * 4), (short)iVar4 != (short)iFan1)
    {
      lVar3 = lVar3 + 1;
      if (lVar2 == lVar3) {
        return -1;
      }
    }
  }
  else {
    if ((iFan0 < 0) || (pLib->vRulesX->nSize <= iFan0)) {
LAB_00448ff6:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                    ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
    }
    pvVar1 = pLib->vRulesX->pArray[(uint)iFan0];
    lVar2 = (long)*(int *)((long)pvVar1 + 4);
    if (lVar2 < 1) {
      return -1;
    }
    lVar3 = 0;
    while (iVar4 = *(int *)(*(long *)((long)pvVar1 + 8) + lVar3 * 4), (short)iVar4 != (short)iFan1)
    {
      lVar3 = lVar3 + 1;
      if (lVar2 == lVar3) {
        return -1;
      }
    }
  }
  return iVar4 >> 0x10;
}

Assistant:

int Amap_LibFindNode( Amap_Lib_t * pLib, int iFan0, int iFan1, int fXor )
{
    if ( fXor )
        return Vec_IntCheckWithMask( (Vec_Int_t *)Vec_PtrEntry(pLib->vRulesX, iFan0), iFan1 );
    else
        return Vec_IntCheckWithMask( (Vec_Int_t *)Vec_PtrEntry(pLib->vRules, iFan0), iFan1 );
}